

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

void quaternion_get_axis_anglev3(quaternion *self,vector3 *vR,float *angle)

{
  short sVar1;
  float f1;
  double dVar2;
  float scale;
  float *angle_local;
  vector3 *vR_local;
  quaternion *self_local;
  
  dVar2 = sqrt((double)(-(self->field_0).q[3] * (self->field_0).q[3] + 1.0));
  f1 = (float)dVar2;
  sVar1 = scalar_equalsf(f1,0.0);
  if (sVar1 == 0) {
    (vR->field_0).v[0] = (self->field_0).q[0] / f1;
    (vR->field_0).v[1] = (self->field_0).q[1] / f1;
    (vR->field_0).v[2] = (self->field_0).q[2] / f1;
  }
  else {
    (vR->field_0).v[0] = (self->field_0).q[0];
    (vR->field_0).v[1] = (self->field_0).q[1];
    (vR->field_0).v[2] = (self->field_0).q[2];
  }
  dVar2 = acos((double)(self->field_0).q[3]);
  *angle = (float)dVar2 * 2.0;
  return;
}

Assistant:

HYPAPI void quaternion_get_axis_anglev3(const struct quaternion *self, struct vector3 *vR, HYP_FLOAT *angle)
{
	/* scale is not same as magnitude */
	HYP_FLOAT scale = HYP_SQRT(1.0f - self->w * self->w);

	/* avoid divide by zero */
	if (scalar_equalsf(scale, 0.0f)) {
		vR->x = self->x;
		vR->y = self->y;
		vR->z = self->z;
	} else {
		vR->x = self->x / scale;
		vR->y = self->y / scale;
		vR->z = self->z / scale;
	}

	*angle = 2.0f * HYP_ACOS(self->w);
}